

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::QualifiedOneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  LogMessage *other;
  Descriptor *extraout_RDX;
  FieldDescriptor *field_00;
  AlphaNum *in_R8;
  string qualification;
  string local_f0;
  string local_d0;
  pointer local_b0;
  char *pcStack_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  if ((((byte)this[1] & 0x10) == 0) || (*(long *)(this + 0x28) == 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1cf);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_b0,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_b0);
    field = (FieldDescriptor *)extraout_RDX;
  }
  QualifiedClassName_abi_cxx11_(&local_d0,*(cpp **)(this + 0x20),(Descriptor *)field);
  local_b0 = local_d0._M_dataplus._M_p;
  pcStack_a8 = (char *)local_d0._M_string_length;
  local_78.piece_data_ = "::";
  local_78.piece_size_ = 2;
  OneofCaseConstantName_abi_cxx11_(&local_f0,this,field_00);
  local_48.piece_data_ = local_f0._M_dataplus._M_p;
  local_48.piece_size_ = local_f0._M_string_length;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_b0,&local_78,&local_48,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedOneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  const std::string qualification =
      QualifiedClassName(field->containing_type());
  return StrCat(qualification, "::", OneofCaseConstantName(field));
}